

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printAssociativeContainer<QMultiMap<QSsl::AlternativeNameEntryType,QString>>
          (QtPrivate *this,QDebug debug,char *which,
          QMultiMap<QSsl::AlternativeNameEntryType,_QString> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
  *pQVar3;
  undefined8 uVar4;
  QDebug this_00;
  storage_type *psVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  storage_type *psVar8;
  _Base_ptr p_Var9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QDebugStateSaver saver;
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar8;
    } while (*pcVar1 != '\0');
  }
  QVar10.m_data = psVar8;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar2 = *(QTextStream **)debug.stream;
  QVar11.m_data = (storage_type *)0x1;
  QVar11.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar3 = (c->d).d.ptr;
  if (pQVar3 == (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                 *)0x0) {
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var6 = *(_Rb_tree_node_base **)(pQVar3 + 0x20);
  }
  pQVar3 = (c->d).d.ptr;
  p_Var7 = (_Rb_tree_node_base *)(pQVar3 + 0x10);
  if (pQVar3 == (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var6 != p_Var7) {
    do {
      QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_68.stream = *debug.stream;
      *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
      qt_QMetaEnum_debugOperator
                (&local_60,(longlong)&local_68,(QMetaObject *)(ulong)p_Var6[1]._M_color,
                 QSsl::staticMetaObject);
      this_00.stream = local_60.stream;
      QVar12.m_data = (storage_type *)0x2;
      QVar12.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      p_Var9 = p_Var6[1]._M_left;
      if (p_Var9 == (_Base_ptr)0x0) {
        p_Var9 = (_Base_ptr)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_60,(ulong)p_Var9);
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_60.stream,')');
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      pQVar3 = (c->d).d.ptr;
      p_Var7 = (_Rb_tree_node_base *)(pQVar3 + 0x10);
      if (pQVar3 == (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                     *)0x0) {
        p_Var7 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var6 != p_Var7);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}